

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

void opus_tags_clear(OpusTags *_tags)

{
  ulong uVar1;
  
  for (uVar1 = (ulong)((_tags->comments + 1) - (uint)(_tags->user_comments == (char **)0x0));
      0 < (int)uVar1; uVar1 = uVar1 - 1) {
    free(_tags->user_comments[uVar1 - 1]);
  }
  free(_tags->user_comments);
  free(_tags->comment_lengths);
  free(_tags->vendor);
  return;
}

Assistant:

void opus_tags_clear(OpusTags *_tags){
  int ncomments;
  int ci;
  ncomments=_tags->comments;
  if(_tags->user_comments!=NULL)ncomments++;
  else{
    OP_ASSERT(ncomments==0);
  }
  for(ci=ncomments;ci-->0;)_ogg_free(_tags->user_comments[ci]);
  _ogg_free(_tags->user_comments);
  _ogg_free(_tags->comment_lengths);
  _ogg_free(_tags->vendor);
}